

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void __thiscall DPSprite::SetState(DPSprite *this,FState *newstate,bool pending)

{
  WORD *pWVar1;
  ushort uVar2;
  APlayerPawn *self;
  bool bVar3;
  uint uVar4;
  int iVar5;
  AActor *stateowner;
  int iVar6;
  FStateParamInfo stp;
  FState *nextstate;
  
  if (this->ID == 1) {
    pWVar1 = &this->Owner->WeaponState;
    *pWVar1 = *pWVar1 & 0xf090;
  }
  this->processPending = pending;
LAB_004c59b0:
  do {
    if (newstate == (FState *)0x0) goto LAB_004c5afb;
    this->State = newstate;
    uVar2 = newstate->sprite;
    if (uVar2 != 1) {
      if ((newstate->field_0x22 & 2) == 0) {
        this->Frame = (uint)newstate->Frame;
      }
      if (uVar2 != 2) {
        this->Sprite = (uint)uVar2;
      }
    }
    uVar4 = FState::GetTics(newstate);
    this->Tics = uVar4;
    iVar5 = this->ID;
    if ((this->Flags & 8) == 0) {
LAB_004c59f5:
      iVar6 = 1000;
      if (iVar5 != 1000) goto LAB_004c5a2c;
    }
    else {
      if (iVar5 != 1 || sv_fastweapons.Value != 2) {
        if (sv_fastweapons.Value != 0) {
          if (sv_fastweapons.Value == 3) {
            iVar5 = FState::GetTics(newstate);
            uVar4 = (uint)(iVar5 != 0);
            this->Tics = uVar4;
            iVar5 = this->ID;
          }
          else {
            this->Tics = 1;
            uVar4 = 1;
          }
        }
        goto LAB_004c59f5;
      }
      uVar4 = (uint)(newstate->ActionFunc != (VMFunction *)0x0);
      this->Tics = uVar4;
      iVar5 = 1;
LAB_004c5a2c:
      if (newstate->Misc1 != 0) {
        this->x = (double)newstate->Misc1;
      }
      iVar6 = iVar5;
      if (newstate->Misc2 != 0) {
        this->y = (double)newstate->Misc2;
      }
    }
    self = this->Owner->mo;
    if (self != (APlayerPawn *)0x0) {
      stp.mStateType = STATE_Psprite;
      stp.mCallingState = newstate;
      stp.mPSPIndex = iVar6;
      stateowner = GC::ReadBarrier<AActor>((AActor **)&this->Caller);
      bVar3 = FState::CallAction(newstate,&self->super_AActor,stateowner,&stp,&nextstate);
      if (bVar3) {
        if (((this->super_DObject).ObjectFlags & 0x20) != 0) {
          return;
        }
        if (nextstate != (FState *)0x0) {
          this->Tics = 0;
          newstate = nextstate;
          goto LAB_004c59b0;
        }
        if (this->State == (FState *)0x0) {
LAB_004c5afb:
          (*(this->super_DObject)._vptr_DObject[4])(this);
          return;
        }
      }
      uVar4 = this->Tics;
    }
    newstate = this->State->NextState;
    if (uVar4 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void DPSprite::SetState(FState *newstate, bool pending)
{
	if (ID == PSP_WEAPON)
	{ // A_WeaponReady will re-set these as needed
		Owner->WeaponState &= ~(WF_WEAPONREADY | WF_WEAPONREADYALT | WF_WEAPONBOBBING | WF_WEAPONSWITCHOK | WF_WEAPONRELOADOK | WF_WEAPONZOOMOK |
								WF_USER1OK | WF_USER2OK | WF_USER3OK | WF_USER4OK);
	}

	processPending = pending;

	do
	{
		if (newstate == nullptr)
		{ // Object removed itself.
			Destroy();
			return;
		}
		State = newstate;

		if (newstate->sprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				Frame = newstate->GetFrame();
			}
			if (newstate->sprite != SPR_NOCHANGE)
			{ // okay to change sprite
				Sprite = newstate->sprite;
			}
		}

		Tics = newstate->GetTics(); // could be 0

		if (Flags & PSPF_CVARFAST)
		{
			if (sv_fastweapons == 2 && ID == PSP_WEAPON)
				Tics = newstate->ActionFunc == nullptr ? 0 : 1;
			else if (sv_fastweapons == 3)
				Tics = (newstate->GetTics() != 0);
			else if (sv_fastweapons)
				Tics = 1;		// great for producing decals :)
		}

		if (ID != PSP_FLASH)
		{ // It's still possible to set the flash layer's offsets with the action function.
			if (newstate->GetMisc1())
			{ // Set coordinates.
				x = newstate->GetMisc1();
			}
			if (newstate->GetMisc2())
			{
				y = newstate->GetMisc2();
			}
		}

		if (Owner->mo != nullptr)
		{
			FState *nextstate;
			FStateParamInfo stp = { newstate, STATE_Psprite, ID };
			if (newstate->CallAction(Owner->mo, Caller, &stp, &nextstate))
			{
				// It's possible this call resulted in this very layer being replaced.
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return;
				}
				if (nextstate != nullptr)
				{
					newstate = nextstate;
					Tics = 0;
					continue;
				}
				if (State == nullptr)
				{
					Destroy();
					return;
				}
			}
		}

		newstate = State->GetNextState();
	} while (!Tics); // An initial state of 0 could cycle through.

	return;
}